

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

int __thiscall
absl::lts_20240722::synchronization_internal::MutexDelay
          (synchronization_internal *this,int32_t c,int mode)

{
  int iVar1;
  int extraout_EDX;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  int iVar2;
  SchedulingMode scheduling_mode;
  ScopedEnable enable_rescheduling;
  
  scheduling_mode = c;
  if ((anonymous_namespace)::globals != 0xdd) {
    base_internal::CallOnceImpl<absl::lts_20240722::(anonymous_namespace)::GetMutexGlobals()::__0>
              ((Nonnull<std::atomic<uint32_t>_*>)&(anonymous_namespace)::globals,c,
               (anon_class_1_0_00000001 *)CONCAT44(in_register_00000014,mode));
    mode = extraout_EDX;
    in_register_00000014 = extraout_var;
  }
  iVar1 = *(int *)(&DAT_001144c8 + (long)c * 4);
  if ((anonymous_namespace)::globals != 0xdd) {
    base_internal::CallOnceImpl<absl::lts_20240722::(anonymous_namespace)::GetMutexGlobals()::__0>
              ((Nonnull<std::atomic<uint32_t>_*>)&(anonymous_namespace)::globals,scheduling_mode,
               (anon_class_1_0_00000001 *)CONCAT44(in_register_00000014,mode));
  }
  iVar2 = (int)this;
  if (iVar1 <= iVar2) {
    if (iVar1 != iVar2) {
      AbslInternalSleepFor_lts_20240722(DAT_001144d0,DAT_001144d8);
      return 0;
    }
    AbslInternalMutexYield_lts_20240722();
  }
  return iVar2 + 1;
}

Assistant:

int MutexDelay(int32_t c, int mode) {
  const int32_t limit = GetMutexGlobals().mutex_sleep_spins[mode];
  const absl::Duration sleep_time = GetMutexGlobals().mutex_sleep_time;
  if (c < limit) {
    // Spin.
    c++;
  } else {
    SchedulingGuard::ScopedEnable enable_rescheduling;
    ABSL_TSAN_MUTEX_PRE_DIVERT(nullptr, 0);
    if (c == limit) {
      // Yield once.
      ABSL_INTERNAL_C_SYMBOL(AbslInternalMutexYield)();
      c++;
    } else {
      // Then wait.
      absl::SleepFor(sleep_time);
      c = 0;
    }
    ABSL_TSAN_MUTEX_POST_DIVERT(nullptr, 0);
  }
  return c;
}